

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O0

void __thiscall Salsa20Cipher::setIv(Salsa20Cipher *this,uint8_t *iv)

{
  reference pvVar1;
  array<unsigned_int,_16UL> *in_RSI;
  unsigned_long sz;
  size_type in_stack_ffffffffffffffc8;
  array<unsigned_int,_16UL> *in_stack_ffffffffffffffd0;
  array<unsigned_int,_16UL> *this_00;
  
  if (in_RSI == (array<unsigned_int,_16UL> *)0x0) {
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    *pvVar1 = 0;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    *pvVar1 = 0;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    *pvVar1 = 0;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    *pvVar1 = 0;
  }
  else {
    this_00 = in_RSI;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](in_RSI,in_stack_ffffffffffffffc8);
    bytesToUint((uint8_t *)this_00,pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](this_00,in_stack_ffffffffffffffc8);
    bytesToUint((uint8_t *)(in_RSI->_M_elems + 1),pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](this_00,in_stack_ffffffffffffffc8);
    *pvVar1 = 0;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](this_00,in_stack_ffffffffffffffc8);
    *pvVar1 = 0;
  }
  return;
}

Assistant:

void setIv(const uint8_t* iv)
	{
		if (iv) {
			const auto sz = sizeof(uint32_t);
			
			bytesToUint(iv + 0 * sz, m_state[6]);
			bytesToUint(iv + 1 * sz, m_state[7]);
			
			m_state[8] = m_state[9] = 0;
		} else {
			m_state[6] = m_state[7] = m_state[8] = m_state[9] = 0;
		}
	}